

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

void linfdelnum(lindef *lin,objnum objn)

{
  _func_void_lindef_ptr_objnum_objnum **pp_Var1;
  ushort *puVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  objnum *poVar7;
  uchar *puVar8;
  uchar *__src;
  uint uVar9;
  long lVar10;
  objnum *__dest;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  size_t __n;
  uint local_b4;
  ulong local_a8;
  _func_void_lindef_ptr_objnum_objnum **local_98;
  size_t local_88;
  undefined1 *local_70;
  
  iVar6 = *(int *)&lin[2].linbuf;
  if (iVar6 != 0) {
    local_70 = (undefined1 *)((long)&lin[1].linrenp + 4);
    local_b4 = (iVar6 + -1 >> 10) + 1;
    local_98 = &lin[1].linrenp;
    while (local_b4 != 0) {
      poVar7 = (objnum *)mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)local_98);
      iVar11 = 0x400;
      if (iVar6 < 0x400) {
        iVar11 = iVar6;
      }
      pp_Var1 = (_func_void_lindef_ptr_objnum_objnum **)((long)local_98 + 2);
      iVar14 = 0;
      iVar5 = 0;
      lVar10 = 0;
      __dest = poVar7;
      while( true ) {
        if (iVar11 <= lVar10) break;
        if (*__dest == objn) {
          uVar9 = 4;
          for (uVar16 = 1; local_a8 = (ulong)(uint)(iVar5 + iVar11),
              (long)(lVar10 + uVar16) < (long)iVar11; uVar16 = uVar16 + 1) {
            if (__dest[uVar16 * 2] != objn) {
              memmove(__dest,(void *)((ulong)uVar9 + (long)__dest),
                      (long)(int)((iVar14 + iVar11 * 4) - uVar9));
              local_a8 = uVar16;
              break;
            }
            uVar9 = uVar9 + 4;
          }
          iVar4 = (int)local_a8;
          if (local_b4 == 1) {
            iVar11 = iVar11 - iVar4;
            local_88 = (size_t)(uint)(iVar4 * 4);
          }
          else {
            puVar8 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var1);
            local_88 = (size_t)(uint)(iVar4 * 4);
            memcpy((void *)((long)((iVar11 - iVar4) * 4) + (long)poVar7),puVar8,local_88);
            mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var1);
          }
          iVar13 = iVar6;
          for (lVar12 = 0; (ulong)local_b4 - 1 != lVar12; lVar12 = lVar12 + 1) {
            iVar15 = 0x400;
            if (iVar13 < 0x400) {
              iVar15 = iVar13;
            }
            puVar8 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_70 + lVar12 * 2 + -2));
            __n = (size_t)((iVar15 - iVar4) * 4);
            memmove(puVar8,puVar8 + local_88,__n);
            if (lVar12 + 2U < (ulong)local_b4) {
              __src = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_70 + lVar12 * 2));
              memcpy(puVar8 + __n,__src,local_88);
              mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_70 + lVar12 * 2));
            }
            uVar3 = *(ushort *)
                     (*(long *)(lin[1].linofsp +
                               (ulong)(*(ushort *)(local_70 + lVar12 * 2 + -2) >> 8) * 8 + 0x30) +
                     (ulong)(*(ushort *)(local_70 + lVar12 * 2 + -2) & 0xff) * 2);
            puVar2 = (ushort *)
                     (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar3 >> 8) * 8) + 0x14 +
                     (ulong)((uVar3 & 0xff) << 5));
            *puVar2 = *puVar2 | 1;
            mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_70 + lVar12 * 2 + -2));
            iVar13 = iVar13 + -0x400;
          }
          lin[2].linbuf = lin[2].linbuf + -(local_a8 & 0xffffffff);
        }
        lVar10 = lVar10 + 1;
        __dest = __dest + 2;
        iVar5 = iVar5 + -1;
        iVar14 = iVar14 + -4;
      }
      uVar3 = *(ushort *)
               (*(long *)(lin[1].linofsp + (ulong)(*(ushort *)local_98 >> 8) * 8 + 0x30) +
               (ulong)(*(ushort *)local_98 & 0xff) * 2);
      puVar2 = (ushort *)
               (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar3 >> 8) * 8) + 0x14 +
               (ulong)((uVar3 & 0xff) << 5));
      *puVar2 = *puVar2 | 1;
      mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)local_98);
      iVar6 = iVar6 + -0x400;
      local_70 = local_70 + 2;
      local_b4 = local_b4 - 1;
      local_98 = pp_Var1;
    }
  }
  return;
}

Assistant:

void linfdelnum(lindef *lin, objnum objn)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    uchar  *objp_orig;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = objp_orig = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            int j;
            
            /* check this one */
            if (osrp2(objp) == objn)
            {
                uchar *nxtp;
                uint pg;
                int delcnt;
                int totrem;
                
                /* 
                 *   it matches - delete it, along with any subsequent
                 *   contiguous entries that also match it 
                 */
                for (delcnt = 1, j = i + 1 ; j < pgtot ; ++j, ++delcnt)
                {
                    /* 
                     *   if this one doesn't match, we've found the end of
                     *   the contiguous records for this object 
                     */
                    if (osrp2(objp + (j - i)*DBGLINFSIZ) != objn)
                        break;
                }

                /* close up the gap on this page */
                if (j < pgtot)
                    memmove(objp, objp + delcnt*DBGLINFSIZ,
                            (pgtot - j)*DBGLINFSIZ);

                /* 
                 *   if this isn't the last page, copy the bottom of the
                 *   next page to the gap at the top of this page 
                 */
                if (pgcnt > 1)
                {
                    /* lock the next page */
                    nxtp = mcmlck(linf->linfmem, *(pgobjn + 1));

                    /* 
                     *   copy from the beginning of the next page to the
                     *   end of this page 
                     */
                    memcpy(objp_orig + (pgtot - delcnt)*DBGLINFSIZ,
                           nxtp, delcnt*DBGLINFSIZ);

                    /* done with the page */
                    mcmunlck(linf->linfmem, *(pgobjn + 1));
                }
                else
                {
                    /* 
                     *   this is the last page, so there's no next page to
                     *   copy items from - reduce the count of items on
                     *   this page accordingly 
                     */
                    pgtot -= delcnt;
                }

                /*
                 *   Now rearrange all subsequent pages to accommodate the
                 *   gap we just created 
                 */
                for (totrem = tot, pg = 1 ; pg < pgcnt ;
                     totrem -= 1024, ++pg)
                {
                    uchar *curp;
                    int curtot;

                    /* figure how many we have on this page */
                    curtot = (totrem > 1024 ? 1024 : totrem);
                    
                    /* lock this page */
                    curp = mcmlck(linf->linfmem, *(pgobjn + pg));

                    /* delete from the start of this page */
                    memmove(curp, curp + delcnt*DBGLINFSIZ,
                            (curtot - delcnt)*DBGLINFSIZ);

                    /* if there's another page, copy from it */
                    if (pg + 1 < pgcnt)
                    {
                        /* lock the next page */
                        nxtp = mcmlck(linf->linfmem, *(pgobjn + pg + 1));

                        /* 
                         *   copy from the start of the next page to the
                         *   end of this page 
                         */
                        memcpy(curp + (curtot - delcnt)*DBGLINFSIZ,
                               nxtp, delcnt*DBGLINFSIZ);

                        /* unlock it */
                        mcmunlck(linf->linfmem, *(pgobjn + pg + 1));
                    }

                    /* done with the page - touch it and unlock it */
                    mcmtch(linf->linfmem, *(pgobjn + pg));
                    mcmunlck(linf->linfmem, *(pgobjn + pg));
                }

                /* deduct the removed records from the total */
                linf->linfcrec -= delcnt;
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}